

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

int __thiscall Procedure::getValue(Procedure *this,string *name,int *val)

{
  __type _Var1;
  size_type sVar2;
  reference pvVar3;
  int local_2c;
  int i;
  int *val_local;
  string *name_local;
  Procedure *this_local;
  
  local_2c = 0;
  while( true ) {
    sVar2 = std::vector<Description,_std::allocator<Description>_>::size(&this->nameTable);
    if (sVar2 <= (ulong)(long)local_2c) {
      return -1;
    }
    pvVar3 = std::vector<Description,_std::allocator<Description>_>::operator[]
                       (&this->nameTable,(long)local_2c);
    _Var1 = std::operator==(&pvVar3->name,name);
    if ((_Var1) &&
       (pvVar3 = std::vector<Description,_std::allocator<Description>_>::operator[]
                           (&this->nameTable,(long)local_2c), pvVar3->kind == 0)) break;
    local_2c = local_2c + 1;
  }
  pvVar3 = std::vector<Description,_std::allocator<Description>_>::operator[]
                     (&this->nameTable,(long)local_2c);
  *val = pvVar3->val;
  return 0;
}

Assistant:

int getValue(const std::string &name, int &val) {
		for (auto i = 0; i < nameTable.size(); i++) {
			if (nameTable[i].name == name) {
				if (nameTable[i].kind != 0) continue;
				val = nameTable[i].val;
				return 0;
			}
		}
		return -1;
	}